

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O3

int CVodeQuadReInit(void *cvode_mem,N_Vector yQ0)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar1 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x4c6;
  }
  else {
    if (*(int *)((long)cvode_mem + 0x854) != 0) {
      N_VScale(0x3ff0000000000000,yQ0,*(undefined8 *)((long)cvode_mem + 0x200));
      *(undefined8 *)((long)cvode_mem + 0x638) = 0;
      *(undefined8 *)((long)cvode_mem + 0x6b0) = 0;
      *(undefined4 *)((long)cvode_mem + 0x5c) = 1;
      return 0;
    }
    msgfmt = "Quadrature integration not activated.";
    iVar1 = -0x1e;
    error_code = -0x1e;
    line = 0x4ce;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeQuadReInit",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                 ,msgfmt);
  return iVar1;
}

Assistant:

int CVodeQuadReInit(void* cvode_mem, N_Vector yQ0)
{
  CVodeMem cv_mem;

  /* Check cvode_mem */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Ckeck if quadrature was initialized? */
  if (cv_mem->cv_QuadMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_QUAD, __LINE__, __func__, __FILE__,
                   MSGCV_NO_QUAD);
    return (CV_NO_QUAD);
  }

  /* Initialize znQ[0] in the history array */
  N_VScale(ONE, yQ0, cv_mem->cv_znQ[0]);

  /* Initialize counters */
  cv_mem->cv_nfQe  = 0;
  cv_mem->cv_netfQ = 0;

  /* Quadrature integration turned ON */
  cv_mem->cv_quadr = SUNTRUE;

  /* Quadrature re-initialization was successfull */
  return (CV_SUCCESS);
}